

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_product_class_init(parser_info *info,char **attr)

{
  int iVar1;
  int iVar2;
  coda_product_class *pcVar3;
  char *filepath;
  coda_product_class *product_class;
  char *pcStack_28;
  int revision;
  char *name;
  char **attr_local;
  parser_info *info_local;
  
  product_class._4_4_ = 0;
  name = (char *)attr;
  attr_local = (char **)info;
  pcStack_28 = get_mandatory_attribute_value(attr,"name",info->node->tag);
  if (pcStack_28 == (char *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = get_product_class_revision((parser_info *)attr_local,(int *)((long)&product_class + 4));
    if (iVar1 == 0) {
      iVar1 = coda_data_dictionary_has_product_class(pcStack_28);
      if (iVar1 != 0) {
        pcVar3 = coda_data_dictionary_get_product_class(pcStack_28);
        iVar1 = product_class._4_4_;
        if (pcVar3 == (coda_product_class *)0x0) {
          return -1;
        }
        iVar2 = coda_product_class_get_revision(pcVar3);
        if (iVar1 <= iVar2) {
          *(undefined4 *)(attr_local + 9) = 1;
          abort_parser((parser_info *)attr_local);
          return 0;
        }
        iVar1 = coda_data_dictionary_remove_product_class(pcVar3);
        if (iVar1 != 0) {
          return -1;
        }
      }
      *(code **)(*attr_local + 0x38) = coda_product_class_delete;
      pcVar3 = coda_product_class_new(pcStack_28);
      attr_local[6] = (char *)pcVar3;
      if (attr_local[6] == (char *)0x0) {
        info_local._4_4_ = -1;
      }
      else {
        pcVar3 = (coda_product_class *)attr_local[6];
        filepath = coda_za_get_filename((za_file *)attr_local[4]);
        iVar1 = coda_product_class_set_definition_file(pcVar3,filepath);
        if (iVar1 == 0) {
          iVar1 = coda_product_class_set_revision
                            ((coda_product_class *)attr_local[6],product_class._4_4_);
          if (iVar1 == 0) {
            *(char **)(*attr_local + 8) = attr_local[6];
            register_sub_element
                      ((node_info *)*attr_local,element_cd_description,string_data_init,
                       cd_product_class_set_description);
            register_sub_element
                      ((node_info *)*attr_local,element_cd_product_type,cd_product_type_init,
                       cd_product_class_add_product_type);
            *(code **)(*attr_local + 0x30) = cd_product_class_finalise;
            info_local._4_4_ = 0;
          }
          else {
            coda_product_class_delete((coda_product_class *)attr_local[6]);
            attr_local[6] = (char *)0x0;
            info_local._4_4_ = -1;
          }
        }
        else {
          coda_product_class_delete((coda_product_class *)attr_local[6]);
          attr_local[6] = (char *)0x0;
          info_local._4_4_ = -1;
        }
      }
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_product_class_init(parser_info *info, const char **attr)
{
    const char *name;
    int revision = 0;

    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    if (get_product_class_revision(info, &revision) != 0)
    {
        return -1;
    }
    /* see if there is already a version of this product class in the data dictionary */
    if (coda_data_dictionary_has_product_class(name))
    {
        coda_product_class *product_class;

        /* compare revision numbers */
        product_class = coda_data_dictionary_get_product_class(name);
        if (product_class == NULL)
        {
            return -1;
        }
        if (revision <= coda_product_class_get_revision(product_class))
        {
            /* the current available product class is as new or newer -> ignore this product class and stop parsing */
            info->ignore_file = 1;
            abort_parser(info);
            return 0;
        }
        /* the current available product class is older -> remove it */
        if (coda_data_dictionary_remove_product_class(product_class) != 0)
        {
            return -1;
        }
    }

    info->node->free_data = (free_data_handler)coda_product_class_delete;
    info->product_class = coda_product_class_new(name);
    if (info->product_class == NULL)
    {
        return -1;
    }
    if (coda_product_class_set_definition_file(info->product_class, za_get_filename(info->zf)) != 0)
    {
        coda_product_class_delete(info->product_class);
        info->product_class = NULL;
        return -1;
    }
    if (coda_product_class_set_revision(info->product_class, revision) != 0)
    {
        coda_product_class_delete(info->product_class);
        info->product_class = NULL;
        return -1;
    }
    info->node->data = info->product_class;

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_class_set_description);
    register_sub_element(info->node, element_cd_product_type, cd_product_type_init, cd_product_class_add_product_type);

    info->node->finalise_element = cd_product_class_finalise;

    return 0;
}